

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O0

void Cudd_IterDerefBdd(DdManager *table,DdNode *n)

{
  int iVar1;
  DdNode **ppDVar2;
  uint uVar3;
  int local_34;
  uint live;
  int SP;
  DdNodePtr *stack;
  DdNode *pDStack_20;
  int ord;
  DdNode *N;
  DdNode *n_local;
  DdManager *table_local;
  
  ppDVar2 = table->stack;
  local_34 = 1;
  uVar3 = table->keys - table->dead;
  if (table->peakLiveNodes < uVar3) {
    table->peakLiveNodes = uVar3;
  }
  pDStack_20 = (DdNode *)((ulong)n & 0xfffffffffffffffe);
  do {
    if (pDStack_20->ref == 1) {
      pDStack_20->ref = 0;
      table->dead = table->dead + 1;
      iVar1 = table->perm[pDStack_20->index];
      ppDVar2[local_34] = (DdNode *)((ulong)(pDStack_20->type).kids.E & 0xfffffffffffffffe);
      table->subtables[iVar1].dead = table->subtables[iVar1].dead + 1;
      pDStack_20 = (pDStack_20->type).kids.T;
      local_34 = local_34 + 1;
    }
    else {
      pDStack_20->ref = pDStack_20->ref - 1;
      local_34 = local_34 + -1;
      pDStack_20 = ppDVar2[local_34];
    }
  } while (local_34 != 0);
  return;
}

Assistant:

void
Cudd_IterDerefBdd(
  DdManager * table,
  DdNode * n)
{
    DdNode *N;
    int ord;
    DdNodePtr *stack = table->stack;
    int SP = 1;

    unsigned int live = table->keys - table->dead;
    if (live > table->peakLiveNodes) {
        table->peakLiveNodes = live;
    }

    N = Cudd_Regular(n);

    do {
#ifdef DD_DEBUG
        assert(N->ref != 0);
#endif

        if (N->ref == 1) {
            N->ref = 0;
            table->dead++;
#ifdef DD_STATS
            table->nodesDropped++;
#endif
            ord = table->perm[N->index];
            stack[SP++] = Cudd_Regular(cuddE(N));
            table->subtables[ord].dead++;
            N = cuddT(N);
        } else {
            cuddSatDec(N->ref);
            N = stack[--SP];
        }
    } while (SP != 0);

}